

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenTableGetSetIndex(BinaryenExpressionRef expr,BinaryenExpressionRef indexExpr)

{
  if (expr->_id != TableGetId) {
    __assert_fail("expression->is<TableGet>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x9c4,
                  "void BinaryenTableGetSetIndex(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (indexExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = indexExpr;
    return;
  }
  __assert_fail("indexExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x9c5,"void BinaryenTableGetSetIndex(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenTableGetSetIndex(BinaryenExpressionRef expr,
                              BinaryenExpressionRef indexExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<TableGet>());
  assert(indexExpr);
  static_cast<TableGet*>(expression)->index = (Expression*)indexExpr;
}